

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

string * __thiscall
LinearSystem::ToString_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  string *psVar1;
  int iVar2;
  Matrix *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Operation *operation;
  pointer operation_00;
  int iVar6;
  bool bVar7;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  int local_31c;
  SwapMatrix local_318;
  LinearSystem *local_300;
  string *local_2f8;
  ExtendedMatrix *local_2f0;
  pointer local_2e8;
  ostringstream local_2e0 [376];
  LinearSystem local_168;
  
  local_2f8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_2e0);
  local_300 = this;
  LinearSystem(&local_168,&this->start_system_,this->mode_);
  operator<<((ostream *)local_2e0,&local_168.system_);
  local_318.first_row_ = 0;
  local_318.second_row_ = 0;
  local_318.first_main_column_ = 0;
  local_318.second_main_column_ = 0;
  local_318.first_extension_column_ = 0;
  local_318.second_extension_column_ = 0;
  operation_00 = (local_300->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_2e8 = (local_300->history_).
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_2f0 = &local_300->system_;
  iVar2 = 0;
  iVar5 = 0;
  iVar4 = 0;
  iVar6 = 0;
  local_31c = 0;
  iVar3 = 0;
  for (; psVar1 = local_2f8, operation_00 != local_2e8; operation_00 = operation_00 + 1) {
    ApplyOperation(&local_168,operation_00);
    if (operation_00->operation_type == SwapColumns) {
      iVar6 = operation_00->lhs + 1;
      iVar4 = operation_00->rhs + 1;
      local_318.second_main_column_ = iVar4;
      local_318.first_main_column_ = iVar6;
    }
    else if (operation_00->operation_type == SwapRows) {
      iVar3 = operation_00->lhs + 1;
      local_31c = operation_00->rhs + 1;
      local_318.second_row_ = local_31c;
      local_318.first_row_ = iVar3;
      if (local_300->mode_ == LU) {
        this_00 = ExtendedMatrix::GetMainMatrix(local_2f0);
        iVar2 = Matrix::GetNumColumns(this_00);
        iVar5 = operation_00->lhs + iVar2 + 1;
        iVar2 = iVar2 + 1 + operation_00->rhs;
        local_318.second_extension_column_ = iVar2;
        local_318.first_extension_column_ = iVar5;
      }
    }
    if ((Options::step_by_step_type == 2) ||
       ((Options::step_by_step_type == 1 && (operation_00->operation_type == MainOutput)))) {
      std::endl<char,std::char_traits<char>>((ostream *)local_2e0);
      if ((iVar3 != local_31c) ||
         ((iVar6 != iVar4 || (bVar7 = iVar5 != iVar2, iVar5 = iVar2, bVar7)))) {
        operator<<((ostream *)local_2e0,&local_318);
        std::endl<char,std::char_traits<char>>((ostream *)local_2e0);
        local_318.first_extension_column_ = 0;
        local_318.second_extension_column_ = 0;
        local_318.first_row_ = 0;
        local_318.second_row_ = 0;
        local_318.first_main_column_ = 0;
        local_318.second_main_column_ = 0;
        iVar5 = 0;
        iVar4 = 0;
        local_31c = 0;
      }
      operator<<((ostream *)local_2e0,&local_168.system_);
      iVar3 = local_31c;
      iVar2 = iVar5;
      iVar6 = iVar4;
    }
  }
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&local_168);
  std::__cxx11::ostringstream::~ostringstream(local_2e0);
  return psVar1;
}

Assistant:

std::string LinearSystem::ToString() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);
  out << current_system.system_;
  SwapMatrix swaps;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
            operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    out << std::endl;

    if (!swaps.IsEmpty()) {
      out << swaps << std::endl;
      swaps.Clear();
    }

    out << current_system.system_;
  }

  return out.str();
}